

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textlabel.cpp
# Opt level: O2

int __thiscall QtMWidgets::TextLabel::heightForWidth(TextLabel *this,int w)

{
  int iVar1;
  int iVar2;
  double in_XMM1_Qa;
  undefined1 auVar3 [16];
  QTextDocument doc;
  QTextDocument local_50 [16];
  QArrayDataPointer<char16_t> local_40;
  
  text((QString *)&local_40,this);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  if (local_40.size == 0) {
    iVar2 = QFrame::frameWidth();
    iVar2 = iVar2 * 2;
  }
  else {
    auVar3 = QWidget::contentsMargins();
    iVar1 = QFrame::frameWidth();
    iVar2 = ((this->d).d)->margin;
    QTextDocument::QTextDocument(local_50,(QObject *)0x0);
    QStaticText::text();
    QTextDocument::setHtml((QString *)local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
    QTextDocument::setTextWidth((double)(w - (auVar3._8_4_ + auVar3._0_4_ + (iVar1 + iVar2) * 2)));
    QStaticText::textOption();
    QTextDocument::setDefaultTextOption((QTextOption *)local_50);
    QTextOption::~QTextOption((QTextOption *)&local_40);
    QTextDocument::size();
    iVar2 = QFrame::frameWidth();
    iVar2 = (int)((double)(((this->d).d)->margin * 2) +
                 (double)auVar3._12_4_ + (double)auVar3._4_4_ + in_XMM1_Qa + (double)(iVar2 * 2));
    QTextDocument::~QTextDocument(local_50);
  }
  return iVar2;
}

Assistant:

int
TextLabel::heightForWidth( int w ) const
{
	if( text().isEmpty() )
		return 2 * frameWidth();

	const QMargins margins = contentsMargins();

	const qreal width = w - 2 * frameWidth() - margins.left() -
		margins.right() - 2 * d->margin;

	QTextDocument doc;
	doc.setHtml( d->staticText.text() );
	doc.setTextWidth( width );
	doc.setDefaultTextOption( d->staticText.textOption() );

	return doc.size().height() +
		2 * frameWidth() + margins.top() +
		margins.bottom() + 2 * d->margin;
}